

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

PClass * __thiscall PClass::CreateDerivedClass(PClass *this,FName *name,uint size)

{
  uint32 *puVar1;
  int iVar2;
  uint uVar3;
  size_t in_RAX;
  PClassActor *old;
  PClass *pPVar4;
  PClassActor *this_00;
  PClassActor *pPVar5;
  PClassActor *pPVar6;
  PClass *pPVar8;
  PType **ppPVar9;
  ulong uVar10;
  ulong uVar11;
  size_t bucket;
  size_t local_38;
  ulong uVar7;
  
  if (size < *(uint *)((long)&(this->super_PNativeStruct).super_PStruct.super_PNamedType.
                              super_PCompoundType.super_PType.super_PTypeBase.super_DObject + 0x24))
  {
    __assert_fail("size >= Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dobjtype.cpp"
                  ,0xccf,"PClass *PClass::CreateDerivedClass(FName, unsigned int)");
  }
  local_38 = in_RAX;
  old = (PClassActor *)
        FTypeTable::FindType(&TypeTable,RegistrationInfo.MyClass,0,(long)name->Index,&local_38);
  if (old != (PClassActor *)0x0) {
    if (*(int *)((long)&(old->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                        super_PCompoundType.super_PType.super_PTypeBase.super_DObject + 0x24) != -1)
    {
      return &((PClassActor *)0x0)->super_PClass;
    }
    pPVar4 = (old->super_PClass).ParentClass;
    pPVar8 = this;
    if (pPVar4 != this) {
      do {
        pPVar8 = pPVar8->ParentClass;
        if (pPVar8 == pPVar4) break;
      } while (pPVar8 != (PClass *)0x0);
      if (pPVar8 == (PClass *)0x0) {
        I_Error("%s must inherit from %s but doesn\'t.",FName::NameData.NameArray[name->Index].Text,
                FName::NameData.NameArray
                [(pPVar4->super_PNativeStruct).super_PStruct.super_PNamedType.TypeName.Index].Text);
      }
    }
    if ((size == 0xffffffff) && ((old->super_PClass).ParentClass == this)) {
      puVar1 = (uint32 *)
               ((long)&(old->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                       super_PCompoundType.super_PType.super_PTypeBase.super_DObject + 0x20);
      *puVar1 = *puVar1 & 0x800;
      return &old->super_PClass;
    }
  }
  if (*(PClass **)
       ((long)&(this->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.
               super_PType.super_PTypeBase.super_DObject + 8) == (PClass *)0x0) {
    pPVar4 = (PClass *)
             (*(code *)*(this->super_PNativeStruct).super_PStruct.super_PNamedType.
                        super_PCompoundType.super_PType.super_PTypeBase.super_DObject._vptr_DObject)
                       (this);
    *(PClass **)
     ((long)&(this->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.
             super_PType.super_PTypeBase.super_DObject + 8) = pPVar4;
  }
  this_00 = (PClassActor *)
            CreateNew(*(PClass **)
                       ((long)&(this->super_PNativeStruct).super_PStruct.super_PNamedType.
                               super_PCompoundType.super_PType.super_PTypeBase.super_DObject + 8));
  iVar2 = name->Index;
  (this_00->super_PClass).bRuntimeClass = true;
  (this_00->super_PClass).ParentClass = this;
  (this_00->super_PClass).ConstructNative = this->ConstructNative;
  (this_00->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.
  super_PType.Symbols.ParentSymbolTable =
       &(this->super_PNativeStruct).super_PStruct.super_PNamedType.super_PCompoundType.super_PType.
        Symbols;
  (this_00->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.TypeName.Index = iVar2;
  FString::Format(&(this_00->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                   super_PCompoundType.super_PType.mDescriptiveName,"Class<%s>",
                  FName::NameData.NameArray[iVar2].Text);
  *(uint *)((long)&(this_00->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                   super_PCompoundType.super_PType.super_PTypeBase + 0x24) = size;
  if (size != 0xffffffff) {
    InitializeDefaults((PClass *)this_00);
    TArray<VMFunction_*,_VMFunction_*>::operator=(&(this_00->super_PClass).Virtuals,&this->Virtuals)
    ;
    (**(code **)(*(long *)&(this->super_PNativeStruct).super_PStruct.super_PNamedType.
                           super_PCompoundType.super_PType.super_PTypeBase.super_DObject + 0xb8))
              (this,this_00);
  }
  if (old == (PClassActor *)0x0) {
    InsertIntoHash((PClass *)this_00);
  }
  else {
    pPVar6 = (PClassActor *)TypeTable.TypeHash[local_38];
    if (pPVar6 != (PClassActor *)0x0) {
      if (pPVar6 == old) {
        ppPVar9 = TypeTable.TypeHash + local_38;
      }
      else {
        do {
          pPVar5 = pPVar6;
          pPVar6 = (PClassActor *)
                   (pPVar5->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                   super_PCompoundType.super_PType.HashNext;
          if (pPVar6 == (PClassActor *)0x0) goto LAB_0037da5d;
        } while (pPVar6 != old);
        ppPVar9 = &(pPVar5->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                   super_PCompoundType.super_PType.HashNext;
      }
      (this_00->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType
      .super_PType.HashNext =
           (pPVar6->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
           super_PCompoundType.super_PType.HashNext;
      (pPVar6->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.super_PCompoundType.
      super_PType.HashNext = (PType *)0x0;
      *ppPVar9 = (PType *)this_00;
    }
LAB_0037da5d:
    DObject::StaticPointerSubstitution((DObject *)old,(DObject *)this_00,true);
    uVar11 = (ulong)PClassActor::AllActorClasses.Count;
    if (uVar11 == 0) {
      uVar7 = 0;
    }
    else {
      uVar10 = 0;
      do {
        uVar7 = uVar10;
        if (PClassActor::AllActorClasses.Array[uVar10] == old) break;
        uVar10 = uVar10 + 1;
        uVar7 = uVar11;
      } while (uVar11 != uVar10);
    }
    uVar3 = (uint)uVar7;
    if (uVar3 < PClassActor::AllActorClasses.Count) {
      PClassActor::AllActorClasses.Count = PClassActor::AllActorClasses.Count - 1;
      if (uVar3 <= PClassActor::AllActorClasses.Count &&
          PClassActor::AllActorClasses.Count - uVar3 != 0) {
        memmove(PClassActor::AllActorClasses.Array + (uVar7 & 0xffffffff),
                PClassActor::AllActorClasses.Array + (uVar3 + 1),
                (ulong)(PClassActor::AllActorClasses.Count - uVar3) << 3);
      }
    }
    uVar11 = (ulong)AllClasses.Count;
    if (uVar11 == 0) {
      uVar7 = 0;
    }
    else {
      uVar10 = 0;
      do {
        uVar7 = uVar10;
        if ((PClassActor *)AllClasses.Array[uVar10] == old) break;
        uVar10 = uVar10 + 1;
        uVar7 = uVar11;
      } while (uVar11 != uVar10);
    }
    uVar3 = (uint)uVar7;
    if (uVar3 < AllClasses.Count) {
      AllClasses.Count = AllClasses.Count - 1;
      if (uVar3 <= AllClasses.Count && AllClasses.Count - uVar3 != 0) {
        memmove(AllClasses.Array + (uVar7 & 0xffffffff),AllClasses.Array + (uVar3 + 1),
                (ulong)(AllClasses.Count - uVar3) << 3);
      }
    }
    (**(code **)(*(long *)&(old->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                           super_PCompoundType.super_PType.super_PTypeBase.super_DObject + 0x20))
              (old);
  }
  return &this_00->super_PClass;
}

Assistant:

PClass *PClass::CreateDerivedClass(FName name, unsigned int size)
{
	assert (size >= Size);
	PClass *type;
	bool notnew;
	size_t bucket;

	PClass *existclass = static_cast<PClass *>(TypeTable.FindType(RUNTIME_CLASS(PClass), /*FIXME:Outer*/0, name, &bucket));

	// This is a placeholder so fill it in
	if (existclass != nullptr)
	{
		if (existclass->Size == TentativeClass)
		{
			if (!IsDescendantOf(existclass->ParentClass))
			{
				I_Error("%s must inherit from %s but doesn't.", name.GetChars(), existclass->ParentClass->TypeName.GetChars());
			}

			if (size == TentativeClass)
			{
				// see if we can reuse the existing class. This is only possible if the inheritance is identical. Otherwise it needs to be replaced.
				if (this == existclass->ParentClass)
				{
					existclass->ObjectFlags &= OF_Transient;
					return existclass;
				}
			}
			notnew = true;
		}
		else
		{
			// a different class with the same name already exists. Let the calling code deal with this.
			return nullptr;
		}
	}
	else
	{
		notnew = false;
	}

	// Create a new type object of the same type as us. (We may be a derived class of PClass.)
	type = static_cast<PClass *>(GetClass()->CreateNew());

	Derive(type, name);
	type->Size = size;
	if (size != TentativeClass)
	{
		type->InitializeDefaults();
		type->Virtuals = Virtuals;
		DeriveData(type);
	}
	if (!notnew)
	{
		type->InsertIntoHash();
	}
	else
	{
		TypeTable.ReplaceType(type, existclass, bucket);
		StaticPointerSubstitution(existclass, type, true);	// replace the old one, also in the actor defaults.
		// Delete the old class from the class lists, both the full one and the actor list.
		auto index = PClassActor::AllActorClasses.Find(static_cast<PClassActor*>(existclass));
		if (index < PClassActor::AllActorClasses.Size()) PClassActor::AllActorClasses.Delete(index);
		index = PClass::AllClasses.Find(existclass);
		if (index < PClass::AllClasses.Size()) PClass::AllClasses.Delete(index);
		// Now we can destroy the old class as nothing should reference it anymore
		existclass->Destroy();
	}
	return type;
}